

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  huff_tables *phVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar7 = pD->m_eob_run;
  if (iVar7 == 0) {
    iVar7 = pD->m_spectral_start;
    if (iVar7 <= pD->m_spectral_end) {
      pcVar3 = pD->m_ac_coeffs[component_id];
      iVar1 = pcVar3->block_size;
      puVar4 = pcVar3->pData;
      iVar2 = pcVar3->block_num_x;
      do {
        phVar5 = pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]];
        uVar11 = (ulong)(int)phVar5->look_up[pD->m_bit_buf >> 0x18];
        if ((long)uVar11 < 0) {
          uVar8 = 0xfffffff8;
          do {
            uVar8 = uVar8 - 1;
            iVar9 = (int)uVar11;
            uVar11 = (ulong)phVar5->tree
                            [-(uint)((pD->m_bit_buf >> (uVar8 & 0x1f) & 1) != 0) - iVar9];
          } while ((int)phVar5->tree[-(uint)((pD->m_bit_buf >> (uVar8 & 0x1f) & 1) != 0) - iVar9] <
                   0);
          uVar8 = -uVar8;
        }
        else {
          uVar8 = (uint)phVar5->code_size[uVar11];
        }
        get_bits_no_markers(pD,uVar8);
        uVar10 = uVar11 >> 4 & 0xfffffff;
        uVar8 = (uint)uVar11 & 0xf;
        iVar9 = (int)uVar10;
        if ((uVar11 & 0xf) == 0) {
          if (iVar9 != 0xf) {
            iVar7 = 1 << ((byte)uVar10 & 0x1f);
            pD->m_eob_run = iVar7;
            if (0xf < (uint)uVar11) {
              uVar6 = get_bits_no_markers(pD,iVar9);
              iVar7 = uVar6 + pD->m_eob_run;
            }
            goto LAB_001228fe;
          }
          if (0x30 < iVar7) goto LAB_00122a64;
          iVar9 = iVar7 + 0xf;
        }
        else {
          iVar9 = iVar9 + iVar7;
          if (0x3f < iVar9) {
LAB_00122a64:
            stop_decoding(pD,JPGD_DECODE_ERROR);
          }
          uVar6 = get_bits_no_markers(pD,uVar8);
          if ((int)uVar6 < *(int *)(s_extend_test + (ulong)uVar8 * 4)) {
            uVar6 = uVar6 + *(int *)(s_extend_offset + (ulong)uVar8 * 4);
          }
          *(short *)(puVar4 + (long)(int)(&g_ZAG)[iVar9] * 2 +
                              (long)(block_y * iVar1 * iVar2) + (long)(block_x * iVar1)) =
               (short)(uVar6 << ((byte)pD->m_successive_low & 0x1f));
        }
        iVar7 = iVar9 + 1;
      } while (iVar9 < pD->m_spectral_end);
    }
  }
  else {
LAB_001228fe:
    pD->m_eob_run = iVar7 + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int k, s, r;

  if (pD->m_eob_run) {
    pD->m_eob_run--;
    return;
  }

  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

  for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++) {
    s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

    r = s >> 4;
    s &= 15;

    if (s) {
      if ((k += r) > 63)
        pD->stop_decoding(JPGD_DECODE_ERROR);

      r = pD->get_bits_no_markers(s);
      s = JPGD_HUFF_EXTEND(r, s);

      p[g_ZAG[k]] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
    } else {
      if (r == 15) {
        if ((k += 15) > 63)
          pD->stop_decoding(JPGD_DECODE_ERROR);
      } else {
        pD->m_eob_run = 1 << r;

        if (r)
          pD->m_eob_run += pD->get_bits_no_markers(r);

        pD->m_eob_run--;

        break;
      }
    }
  }
}